

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmJsUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,uint C1)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 local_21 [8];
  OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (C1 < 0x100)) {
    bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                  ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                  "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
    if ((ushort)(op - StartCall) < 0xfff8) {
      puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
      *puVar1 = *puVar1 + 1;
    }
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
    ByteCodeWriter::Data::Write(this_00,local_21,1);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmJsUnsigned1(OpCodeAsmJs op, uint C1)
    {
        OpLayoutT_AsmUnsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }